

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O3

bool __thiscall Minefield::isGameWon(Minefield *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar2 = this->given_x_dimension;
  if ((this->opened_mine == false) &&
     (this->given_mine_count < this->given_y_dimension * iVar2 - this->open_cnt)) {
LAB_0010db34:
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (0 < iVar2) {
      iVar3 = this->given_y_dimension;
      lVar7 = 0;
      do {
        if (0 < iVar3) {
          uVar6 = 0;
          do {
            bVar1 = isOpen(this,(int)lVar7,(int)uVar6);
            if ((!bVar1) &&
               ((*(ulong *)(*(long *)&(this->mines).
                                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                      super__Bvector_base<std::allocator<bool>_>._M_impl +
                           (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) == 0)) goto LAB_0010db34;
            uVar5 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            iVar3 = this->given_y_dimension;
          } while ((int)uVar5 < iVar3);
          iVar2 = this->given_x_dimension;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar2);
    }
  }
  return bVar4;
}

Assistant:

bool Minefield::isGameWon() {
    if (! isGameEnded()) {
        return false;
    }

    // all fields w/o mines are opened
    // -> no field opened w/o mine
    for (int x = 0; x < getXDimension(); x++) {
        for (int y = 0; y < getYDimension(); y++) {
            if ((! isOpen(x, y)) && (! mines[x][y])) {
                // field w/o mine has not been opened
                return false;
            }
        }
    }

    // all fields w/o mines are opened
    return true;
}